

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

string * __thiscall pbrt::RealisticCamera::ToString_abi_cxx11_(RealisticCamera *this)

{
  string *in_RDI;
  CameraBase *in_stack_00000030;
  vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>
  *in_stack_ffffffffffffffc0;
  vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
  *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  CameraBase::ToString_abi_cxx11_(in_stack_00000030);
  StringPrintf<std::__cxx11::string,pstd::vector<pbrt::RealisticCamera::LensElementInterface,pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>>const&,pstd::vector<pbrt::Bounds2<float>,pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>>>const&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

std::string RealisticCamera::ToString() const {
    return StringPrintf(
        "[ RealisticCamera %s elementInterfaces: %s exitPupilBounds: %s ]",
        CameraBase::ToString(), elementInterfaces, exitPupilBounds);
}